

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Reverse
          (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this)

{
  Type_conflict pSVar1;
  bool bVar2;
  Type_conflict *ppSVar3;
  NodeBase *next;
  NodeBase *current;
  NodeBase *prev;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar3;
  current = &this->super_SListNodeBase<Memory::ArenaAllocator>;
  while( true ) {
    bVar2 = IsHead(this,next);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar1 = *ppSVar3;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    *ppSVar3 = current;
    current = next;
    next = pSVar1;
  }
  ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
  *ppSVar3 = current;
  return;
}

Assistant:

void Reverse()
    {
        NodeBase * prev = this;
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            current->Next() = prev;
            prev = current;
            current = next;
        }
        current->Next() = prev;
    }